

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbiscan.cpp
# Opt level: O2

void __thiscall icu_63::RBBIRuleScanner::parse(RBBIRuleScanner *this)

{
  byte bVar1;
  char cVar2;
  uint c;
  int iVar3;
  UBool UVar4;
  uint uVar5;
  int iVar6;
  RBBIRuleBuilder *pRVar7;
  UErrorCode UVar8;
  ushort uVar9;
  char *pcVar10;
  
  if (*this->fRB->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
    nextChar(this,&this->fC);
    uVar9 = 1;
LAB_00297ef7:
    pRVar7 = this->fRB;
    UVar8 = *pRVar7->fStatus;
    if ((U_ZERO_ERROR < UVar8) || (uVar9 == 0)) goto LAB_00298078;
    pcVar10 = gRuleParseStateTable + (ulong)uVar9 * 8 + 7;
    while( true ) {
      bVar1 = pcVar10[-3];
      cVar2 = (this->fC).fEscaped;
      c = (this->fC).fChar;
      uVar5 = (uint)bVar1;
      if ((c == uVar5 && cVar2 == '\0') && bVar1 < 0x7f) break;
      if (bVar1 == 0xfe) {
        if (cVar2 != '\0') break;
      }
      else {
        if (uVar5 == 0xff) break;
        if (uVar5 == 0xfd && cVar2 != '\0') {
          if ((c | 0x20) == 0x70) break;
        }
        else if (uVar5 == 0xfc && c == 0xffffffff) break;
      }
      if (((cVar2 == '\0' && c != 0xffffffff) && (char)bVar1 < -0x10) &&
         (UVar4 = UnicodeSet::contains
                            ((UnicodeSet *)(&this->field_0x480 + (ulong)(bVar1 & 0x7f) * 0x58),c),
         UVar4 != '\0')) break;
      pcVar10 = pcVar10 + 8;
    }
    UVar4 = doParseActions(this,*(int32_t *)(pcVar10 + -7));
    if (UVar4 != '\0') {
      bVar1 = pcVar10[-1];
      if (bVar1 != 0) {
        iVar3 = this->fStackPtr;
        iVar6 = iVar3 + 1;
        this->fStackPtr = iVar6;
        if (0x62 < iVar3) {
          error(this,U_BRK_ERROR_START);
          iVar6 = this->fStackPtr + -1;
          this->fStackPtr = iVar6;
        }
        this->fStack[iVar6] = (ushort)bVar1;
      }
      if (*pcVar10 != '\0') {
        nextChar(this,&this->fC);
      }
      uVar9 = (ushort)(byte)pcVar10[-2];
      if (uVar9 == 0xff) {
        iVar6 = this->fStackPtr;
        uVar9 = this->fStack[iVar6];
        this->fStackPtr = iVar6 + -1;
        if ((long)iVar6 < 1) {
          error(this,U_BRK_ERROR_START);
          this->fStackPtr = this->fStackPtr + 1;
        }
      }
      goto LAB_00297ef7;
    }
    pRVar7 = this->fRB;
    UVar8 = *pRVar7->fStatus;
LAB_00298078:
    if ((UVar8 < U_ILLEGAL_ARGUMENT_ERROR) && (pRVar7->fForwardTree == (RBBINode *)0x0)) {
      error(this,U_BRK_RULE_SYNTAX);
      return;
    }
  }
  return;
}

Assistant:

void RBBIRuleScanner::parse() {
    uint16_t                state;
    const RBBIRuleTableEl  *tableEl;

    if (U_FAILURE(*fRB->fStatus)) {
        return;
    }

    state = 1;
    nextChar(fC);
    //
    // Main loop for the rule parsing state machine.
    //   Runs once per state transition.
    //   Each time through optionally performs, depending on the state table,
    //      - an advance to the the next input char
    //      - an action to be performed.
    //      - pushing or popping a state to/from the local state return stack.
    //
    for (;;) {
        //  Bail out if anything has gone wrong.
        //  RBBI rule file parsing stops on the first error encountered.
        if (U_FAILURE(*fRB->fStatus)) {
            break;
        }

        // Quit if state == 0.  This is the normal way to exit the state machine.
        //
        if (state == 0) {
            break;
        }

        // Find the state table element that matches the input char from the rule, or the
        //    class of the input character.  Start with the first table row for this
        //    state, then linearly scan forward until we find a row that matches the
        //    character.  The last row for each state always matches all characters, so
        //    the search will stop there, if not before.
        //
        tableEl = &gRuleParseStateTable[state];
        #ifdef RBBI_DEBUG
            if (fRB->fDebugEnv && uprv_strstr(fRB->fDebugEnv, "scan")) {
                RBBIDebugPrintf("char, line, col = (\'%c\', %d, %d)    state=%s ",
                    fC.fChar, fLineNum, fCharNum, RBBIRuleStateNames[state]);
            }
        #endif

        for (;;) {
            #ifdef RBBI_DEBUG
                if (fRB->fDebugEnv && uprv_strstr(fRB->fDebugEnv, "scan")) { RBBIDebugPrintf("."); fflush(stdout);}
            #endif
            if (tableEl->fCharClass < 127 && fC.fEscaped == FALSE &&   tableEl->fCharClass == fC.fChar) {
                // Table row specified an individual character, not a set, and
                //   the input character is not escaped, and
                //   the input character matched it.
                break;
            }
            if (tableEl->fCharClass == 255) {
                // Table row specified default, match anything character class.
                break;
            }
            if (tableEl->fCharClass == 254 && fC.fEscaped)  {
                // Table row specified "escaped" and the char was escaped.
                break;
            }
            if (tableEl->fCharClass == 253 && fC.fEscaped &&
                (fC.fChar == 0x50 || fC.fChar == 0x70 ))  {
                // Table row specified "escaped P" and the char is either 'p' or 'P'.
                break;
            }
            if (tableEl->fCharClass == 252 && fC.fChar == (UChar32)-1)  {
                // Table row specified eof and we hit eof on the input.
                break;
            }

            if (tableEl->fCharClass >= 128 && tableEl->fCharClass < 240 &&   // Table specs a char class &&
                fC.fEscaped == FALSE &&                                      //   char is not escaped &&
                fC.fChar != (UChar32)-1) {                                   //   char is not EOF
                U_ASSERT((tableEl->fCharClass-128) < UPRV_LENGTHOF(fRuleSets));
                if (fRuleSets[tableEl->fCharClass-128].contains(fC.fChar)) {
                    // Table row specified a character class, or set of characters,
                    //   and the current char matches it.
                    break;
                }
            }

            // No match on this row, advance to the next  row for this state,
            tableEl++;
        }
        if (fRB->fDebugEnv && uprv_strstr(fRB->fDebugEnv, "scan")) { RBBIDebugPuts("");}

        //
        // We've found the row of the state table that matches the current input
        //   character from the rules string.
        // Perform any action specified  by this row in the state table.
        if (doParseActions((int32_t)tableEl->fAction) == FALSE) {
            // Break out of the state machine loop if the
            //   the action signalled some kind of error, or
            //   the action was to exit, occurs on normal end-of-rules-input.
            break;
        }

        if (tableEl->fPushState != 0) {
            fStackPtr++;
            if (fStackPtr >= kStackSize) {
                error(U_BRK_INTERNAL_ERROR);
                RBBIDebugPuts("RBBIRuleScanner::parse() - state stack overflow.");
                fStackPtr--;
            }
            fStack[fStackPtr] = tableEl->fPushState;
        }

        if (tableEl->fNextChar) {
            nextChar(fC);
        }

        // Get the next state from the table entry, or from the
        //   state stack if the next state was specified as "pop".
        if (tableEl->fNextState != 255) {
            state = tableEl->fNextState;
        } else {
            state = fStack[fStackPtr];
            fStackPtr--;
            if (fStackPtr < 0) {
                error(U_BRK_INTERNAL_ERROR);
                RBBIDebugPuts("RBBIRuleScanner::parse() - state stack underflow.");
                fStackPtr++;
            }
        }

    }

    if (U_FAILURE(*fRB->fStatus)) {
        return;
    }
    
    // If there are no forward rules set an error.
    //
    if (fRB->fForwardTree == NULL) {
        error(U_BRK_RULE_SYNTAX);
        return;
    }

    //
    // Parsing of the input RBBI rules is complete.
    // We now have a parse tree for the rule expressions
    // and a list of all UnicodeSets that are referenced.
    //
#ifdef RBBI_DEBUG
    if (fRB->fDebugEnv && uprv_strstr(fRB->fDebugEnv, "symbols")) {fSymbolTable->rbbiSymtablePrint();}
    if (fRB->fDebugEnv && uprv_strstr(fRB->fDebugEnv, "ptree")) {
        RBBIDebugPrintf("Completed Forward Rules Parse Tree...\n");
        RBBINode::printTree(fRB->fForwardTree, TRUE);
        RBBIDebugPrintf("\nCompleted Reverse Rules Parse Tree...\n");
        RBBINode::printTree(fRB->fReverseTree, TRUE);
        RBBIDebugPrintf("\nCompleted Safe Point Forward Rules Parse Tree...\n");
        RBBINode::printTree(fRB->fSafeFwdTree, TRUE);
        RBBIDebugPrintf("\nCompleted Safe Point Reverse Rules Parse Tree...\n");
        RBBINode::printTree(fRB->fSafeRevTree, TRUE);
    }
#endif
}